

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O2

void __thiscall
TPZDohrPrecond<double,_TPZDohrSubstruct<double>_>::TPZDohrPrecond
          (TPZDohrPrecond<double,_TPZDohrSubstruct<double>_> *this)

{
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZDohrPrecond_01817728;
  (this->fGlobal).
  super__List_base<TPZAutoPointer<TPZDohrSubstruct<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<double>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->fGlobal;
  (this->fGlobal).
  super__List_base<TPZAutoPointer<TPZDohrSubstruct<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<double>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->fGlobal;
  (this->fGlobal).
  super__List_base<TPZAutoPointer<TPZDohrSubstruct<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<double>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this->fCoarse = (TPZStepSolver<double> *)0x0;
  this->fNumCoarse = -1;
  this->fNumThreads = -1;
  TPZAutoPointer<TPZDohrAssembly<double>_>::TPZAutoPointer(&this->fAssemble);
  return;
}

Assistant:

TPZDohrPrecond<TVar, TSubStruct>::~TPZDohrPrecond()
{
	if (fCoarse)
	{
		delete fCoarse;
		fCoarse = 0;
	}
}